

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_common.c
# Opt level: O0

void sylvan_rehash_all_CALL(WorkerP *w,Task *__dq_head)

{
  int iVar1;
  Task *__dq_head_local;
  WorkerP *w_local;
  
  llmsset_clear_hashes_RUN(nodes);
  iVar1 = llmsset_rehash_RUN(nodes);
  if (iVar1 != 0) {
    fprintf(_stderr,"sylvan_gc_rehash error: not all nodes could be rehashed!\n");
    exit(1);
  }
  return;
}

Assistant:

VOID_TASK_IMPL_0(sylvan_rehash_all)
{
    // clear hash array
    llmsset_clear_hashes(nodes);

    // rehash marked nodes
    if (llmsset_rehash(nodes) != 0) {
        fprintf(stderr, "sylvan_gc_rehash error: not all nodes could be rehashed!\n");
        exit(1);
    }
}